

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

Status GetStatus(Status *s)

{
  int *piVar1;
  undefined8 *in_RDI;
  
  piVar1 = (int *)s->rep_;
  *in_RDI = piVar1;
  if (((ulong)piVar1 & 1) == 0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return (Status)(uintptr_t)in_RDI;
}

Assistant:

absl::Status GetStatus(const absl::Status& s) { return s; }